

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_stats.cpp
# Opt level: O3

string * __thiscall
duckdb::GetStringMinMaxValue_abi_cxx11_(string *__return_storage_ptr__,duckdb *this,data_t *data)

{
  idx_t len;
  long lVar1;
  
  lVar1 = 0;
  do {
    if (this[lVar1] == (duckdb)0x0) goto LAB_005f2b7e;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 8);
  lVar1 = 8;
LAB_005f2b7e:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,this,this + lVar1);
  return __return_storage_ptr__;
}

Assistant:

string GetStringMinMaxValue(const data_t data[]) {
	idx_t len;
	for (len = 0; len < StringStatsData::MAX_STRING_MINMAX_SIZE; len++) {
		if (!data[len]) {
			break;
		}
	}
	return string(const_char_ptr_cast(data), len);
}